

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O3

bool __thiscall
YAML::detail::node::equals<std::__cxx11::string>
          (node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs,
          shared_memory_holder *pMemory)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  int iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lhs;
  Node local_88;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_88.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (pMemory->super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this_00 = (pMemory->super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_88.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_88.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_00421b91;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_00421b91:
  local_88.m_invalidKey.field_2._M_local_buf[0] = '\0';
  local_88.m_invalidKey._M_string_length = 0;
  local_88.m_isValid = true;
  paVar3 = &local_88.m_invalidKey.field_2;
  local_88.m_invalidKey._M_dataplus._M_p = (pointer)paVar3;
  local_88.m_pNode = this;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  bVar1 = convert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::decode(&local_88,&local_48);
  if (local_88.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_invalidKey._M_dataplus._M_p != paVar3) {
    operator_delete(local_88.m_invalidKey._M_dataplus._M_p);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((bVar1) && (local_48._M_string_length == rhs->_M_string_length)) {
    if (local_48._M_string_length == 0) {
      bVar1 = true;
    }
    else {
      iVar2 = bcmp(local_48._M_dataplus._M_p,(rhs->_M_dataplus)._M_p,local_48._M_string_length);
      bVar1 = iVar2 == 0;
    }
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

inline bool node::equals(const T& rhs, shared_memory_holder pMemory) {
  T lhs;
  if (convert<T>::decode(Node(*this, pMemory), lhs)) {
    return lhs == rhs;
  }
  return false;
}